

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_dictionary.hpp
# Opt level: O2

bool __thiscall
ArgumentDictionary::get_boolean(ArgumentDictionary *this,string *name,bool default_value)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *__str;
  string contents;
  string negation_param;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"no",name);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->_args_map,&local_40);
  if (sVar2 == 0) {
    __str = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(&this->_args_map,name);
    std::__cxx11::string::string((string *)&local_60,__str);
    stringtools::to_lower(&local_60);
    bVar1 = std::operator==(&local_60,"false");
    bVar1 = !bVar1;
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

[[nodiscard]] bool get_boolean(const std::string& name, bool default_value = false) const
    {
        // "--noParam" <==> "--param=false"
        std::string negation_param = "no" + name;
        if (_args_map.count(negation_param))
            return false;

        try {
            std::string contents = _args_map.at(name);
            stringtools::to_lower(contents);

            // "--param=false"
            if (contents == "false")
                return false;

            // "--param=true" or "--param"
            return true;
        } catch (std::out_of_range&) {
            // No trace of "--param" or "--noParam", return default value
            return default_value;
        }
    }